

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.hpp
# Opt level: O3

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,mrg5s *R)

{
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar1;
  long lVar2;
  parameter_type P_new;
  status_type S_new;
  delim_c local_68;
  delim_c local_67;
  delim_c local_66;
  delim_c local_65;
  undefined4 local_64;
  delim_str local_60;
  mrg_parameter<int,_5,_trng::mrg5s> local_58;
  mrg_status<int,_5,_trng::mrg5s> local_44;
  
  local_58.a[4] = 0;
  local_58.a[0] = 0;
  local_58.a[1] = 0;
  local_58.a[2] = 0;
  local_58.a[3] = 0;
  local_44.r[0] = 0;
  local_44.r[1] = 1;
  local_44.r[2] = 1;
  local_44.r[3] = 1;
  local_44.r[4] = 1;
  local_64 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  utility::operator>>(in,(ignore_spaces_cl *)&local_60);
  local_65.c = '[';
  pbVar1 = utility::operator>>(in,&local_65);
  local_60.str = mrg5s::name();
  pbVar1 = utility::operator>>(pbVar1,&local_60);
  local_66.c = ' ';
  pbVar1 = utility::operator>>(pbVar1,&local_66);
  pbVar1 = operator>>(pbVar1,&local_58);
  local_67.c = ' ';
  pbVar1 = utility::operator>>(pbVar1,&local_67);
  pbVar1 = operator>>(pbVar1,&local_44);
  local_68.c = ']';
  utility::operator>>(pbVar1,&local_68);
  lVar2 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar2 + 0x20] & 5) == 0) {
    (R->P).a[4] = local_58.a[4];
    *(undefined8 *)(R->P).a = local_58.a._0_8_;
    *(undefined8 *)((R->P).a + 2) = local_58.a._8_8_;
    (R->S).r[4] = local_44.r[4];
    *(ulong *)(R->S).r = CONCAT44(local_44.r[1],local_44.r[0]);
    *(ulong *)((R->S).r + 2) = CONCAT44(local_44.r[3],local_44.r[2]);
    lVar2 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar2 + 0x18) = local_64;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg5s &R) {
      mrg5s::parameter_type P_new;
      mrg5s::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(mrg5s::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }